

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_async_future.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *this;
  has_execute_member *phVar3;
  bool local_151;
  undefined1 *local_150;
  async_future<bool> local_148;
  undefined1 local_132 [8];
  has_execute_member exec_4;
  bool continuation_has_run;
  async_future<bool> f;
  promise<bool> p;
  undefined1 local_108 [8];
  executor_future_or_t<has_execute_member,_typename_std::result_of<typename_std::decay<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_async_future_cpp:114:29)>::type_(async_future<void>)>::type,_async_future_clang_workaround>
  f1_3;
  int result_3;
  has_execute_member exec_3;
  async_future<void> f0_5;
  int result_2;
  executor_future_or_t<has_execute_member,_typename_std::result_of<typename_std::decay<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_async_future_cpp:95:29)>::type_(async_future<void>)>::type,_async_future_clang_workaround>
  f1_2;
  undefined1 local_c0 [7];
  has_execute_member exec_2;
  async_future<void> f0_4;
  undefined1 local_a8 [8];
  executor_future_or_t<has_execute_member,_typename_std::result_of<typename_std::decay<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_async_future_cpp:77:29)>::type_(async_future<int>)>::type,_async_future_clang_workaround>
  f1_1;
  undefined1 local_8d;
  int result_1;
  has_execute_member exec_1;
  async_future<int> f0_3;
  int result;
  executor_future_or_t<has_execute_member,_typename_std::result_of<typename_std::decay<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_async_future_cpp:58:29)>::type_(async_future<int>)>::type,_async_future_clang_workaround>
  f1;
  undefined1 local_58 [3];
  has_execute_member exec;
  async_future<int> f0_2;
  async_future<void> f0_1;
  int local_24;
  undefined1 local_20 [8];
  async_future<int> f0;
  
  f0.ptr_to_state_.
  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  local_24 = 0xd;
  std::experimental::v1::detail::async_future<int>::make_ready<int,_nullptr>
            ((async_future<int> *)local_20,&local_24);
  bVar1 = std::experimental::v1::detail::async_future<int>::valid((async_future<int> *)local_20);
  if (!bVar1) {
    __assert_fail("f0.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x24,"int main()");
  }
  bVar1 = std::experimental::v1::detail::async_future<int>::is_ready((async_future<int> *)local_20);
  if (!bVar1) {
    __assert_fail("f0.is_ready()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x25,"int main()");
  }
  iVar2 = std::experimental::v1::detail::async_future<int>::get((async_future<int> *)local_20);
  if (iVar2 != 0xd) {
    __assert_fail("13 == f0.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x27,"int main()");
  }
  std::experimental::v1::detail::async_future<int>::~async_future((async_future<int> *)local_20);
  std::experimental::v1::detail::async_future<void>::make_ready<void,_nullptr>();
  bVar1 = std::experimental::v1::detail::async_future<void>::valid
                    ((async_future<void> *)
                     &f0_2.ptr_to_state_.
                      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  if (!bVar1) {
    __assert_fail("f0.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x2e,"int main()");
  }
  bVar1 = std::experimental::v1::detail::async_future<void>::is_ready
                    ((async_future<void> *)
                     &f0_2.ptr_to_state_.
                      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  if (!bVar1) {
    __assert_fail("f0.is_ready()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x2f,"int main()");
  }
  std::experimental::v1::detail::async_future<void>::~async_future
            ((async_future<void> *)
             &f0_2.ptr_to_state_.
              super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  f1.ptr_to_state_.
  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0xd;
  std::experimental::v1::detail::async_future<int>::make_ready<int,_nullptr>
            ((async_future<int> *)local_58,
             (int *)((long)&f1.ptr_to_state_.
                            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 4));
  bVar1 = std::experimental::v1::detail::async_future<int>::valid((async_future<int> *)local_58);
  if (!bVar1) {
    __assert_fail("f0.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x36,"int main()");
  }
  bVar1 = std::experimental::v1::detail::async_future<int>::is_ready((async_future<int> *)local_58);
  if (!bVar1) {
    __assert_fail("f0.is_ready()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x37,"int main()");
  }
  std::experimental::v1::detail::async_future<int>::then<has_execute_member,main::__0>
            ((async_future<int> *)&result,(has_execute_member *)local_58,
             (anon_class_1_0_00000001_for_func *)
             ((long)&f1.ptr_to_state_.
                     super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 3));
  iVar2 = std::experimental::v1::detail::async_future<int>::get((async_future<int> *)&result);
  if (iVar2 != 0x14) {
    __assert_fail("result == 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x41,"int main()");
  }
  std::experimental::v1::detail::async_future<int>::~async_future((async_future<int> *)&result);
  std::experimental::v1::detail::async_future<int>::~async_future((async_future<int> *)local_58);
  result_1 = 0xd;
  std::experimental::v1::detail::async_future<int>::make_ready<int,_nullptr>
            ((async_future<int> *)&stack0xffffffffffffff78,&result_1);
  bVar1 = std::experimental::v1::detail::async_future<int>::valid
                    ((async_future<int> *)&stack0xffffffffffffff78);
  if (!bVar1) {
    __assert_fail("f0.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x48,"int main()");
  }
  bVar1 = std::experimental::v1::detail::async_future<int>::is_ready
                    ((async_future<int> *)&stack0xffffffffffffff78);
  if (!bVar1) {
    __assert_fail("f0.is_ready()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x49,"int main()");
  }
  f1_1.ptr_to_state_.
  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  phVar3 = (has_execute_member *)&stack0xffffffffffffff78;
  std::experimental::v1::detail::async_future<int>::then<has_execute_member,main::__1>
            ((async_future<int> *)local_a8,phVar3,(anon_class_8_1_6971b95b_for_func *)&local_8d);
  std::experimental::v1::detail::async_future<void>::wait((async_future<void> *)local_a8,phVar3);
  if (f1_1.ptr_to_state_.
      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ != 0x14) {
    __assert_fail("result == 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x54,"int main()");
  }
  std::experimental::v1::detail::async_future<void>::~async_future((async_future<void> *)local_a8);
  std::experimental::v1::detail::async_future<int>::~async_future
            ((async_future<int> *)&stack0xffffffffffffff78);
  std::experimental::v1::detail::async_future<void>::make_ready<void,_nullptr>();
  bVar1 = std::experimental::v1::detail::async_future<void>::valid((async_future<void> *)local_c0);
  if (!bVar1) {
    __assert_fail("f0.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x5b,"int main()");
  }
  bVar1 = std::experimental::v1::detail::async_future<void>::is_ready
                    ((async_future<void> *)local_c0);
  if (!bVar1) {
    __assert_fail("f0.is_ready()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x5c,"int main()");
  }
  std::experimental::v1::detail::async_future<void>::then<has_execute_member,main::__2>
            ((async_future<void> *)&result_2,(has_execute_member *)local_c0,
             (anon_class_1_0_00000001_for_func *)
             ((long)&f1_2.ptr_to_state_.
                     super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  iVar2 = std::experimental::v1::detail::async_future<int>::get((async_future<int> *)&result_2);
  if (iVar2 != 0x14) {
    __assert_fail("result == 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x66,"int main()");
  }
  std::experimental::v1::detail::async_future<int>::~async_future((async_future<int> *)&result_2);
  std::experimental::v1::detail::async_future<void>::~async_future((async_future<void> *)local_c0);
  std::experimental::v1::detail::async_future<void>::make_ready<void,_nullptr>();
  bVar1 = std::experimental::v1::detail::async_future<void>::valid((async_future<void> *)&result_3);
  if (!bVar1) {
    __assert_fail("f0.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x6d,"int main()");
  }
  bVar1 = std::experimental::v1::detail::async_future<void>::is_ready
                    ((async_future<void> *)&result_3);
  if (!bVar1) {
    __assert_fail("f0.is_ready()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x6e,"int main()");
  }
  f1_3.ptr_to_state_.
  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 0;
  phVar3 = (has_execute_member *)&result_3;
  std::experimental::v1::detail::async_future<void>::then<has_execute_member,main::__3>
            ((async_future<void> *)local_108,phVar3,
             (anon_class_8_1_6971b95b_for_func *)
             ((long)&f1_3.ptr_to_state_.
                     super___shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::experimental::v1::detail::async_future<void>::wait((async_future<void> *)local_108,phVar3);
  if ((int)f1_3.ptr_to_state_.
           super___shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi != 0x14) {
    __assert_fail("result == 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x7a,"int main()");
  }
  std::experimental::v1::detail::async_future<void>::~async_future((async_future<void> *)local_108);
  std::experimental::v1::detail::async_future<void>::~async_future((async_future<void> *)&result_3);
  std::experimental::v1::promise<bool>::promise
            ((promise<bool> *)
             &f.ptr_to_state_.
              super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::experimental::v1::promise<bool>::get_async_future((promise<bool> *)(local_132 + 2));
  local_132[1] = 0;
  local_150 = local_132 + 1;
  std::experimental::v1::detail::async_future<bool>::then<has_execute_member,main::__4>
            (&local_148,(has_execute_member *)(local_132 + 2),
             (anon_class_8_1_3d63a45c_for_func *)local_132);
  std::experimental::v1::detail::async_future<void>::~async_future((async_future<void> *)&local_148)
  ;
  if (((local_132[1] ^ 0xff) & 1) == 0) {
    __assert_fail("!continuation_has_run",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x8d,"int main()");
  }
  local_151 = false;
  std::experimental::v1::promise<bool>::set_value<bool,_nullptr>
            ((promise<bool> *)
             &f.ptr_to_state_.
              super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,&local_151);
  if ((local_132[1] & 1) != 0) {
    std::experimental::v1::detail::async_future<bool>::~async_future
              ((async_future<bool> *)(local_132 + 2));
    std::experimental::v1::promise<bool>::~promise
              ((promise<bool> *)
               &f.ptr_to_state_.
                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    this = std::operator<<((ostream *)&std::cout,"OK");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    return f0.ptr_to_state_.
           super___shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._4_4_;
  }
  __assert_fail("continuation_has_run",
                "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                ,0x8f,"int main()");
}

Assistant:

int main()
{
  using namespace std::experimental::v1::detail;

  {
    // non-void make_ready()

    async_future<int> f0 = async_future<int>::make_ready(13);
    assert(f0.valid());
    assert(f0.is_ready());

    assert(13 == f0.get());
  }

  {
    // void make_ready()

    async_future<void> f0 = async_future<void>::make_ready();
    assert(f0.valid());
    assert(f0.is_ready());
  }

  {
    // non-void -> non-void then()

    async_future<int> f0 = async_future<int>::make_ready(13);
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    auto f1 = f0.then(exec, [](async_future<int> predecessor)
    {
      return predecessor.get() + 7;
    });

    int result = f1.get();

    assert(result == 20);
  }

  {
    // non-void -> void then()

    async_future<int> f0 = async_future<int>::make_ready(13);
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    int result = 0;
    auto f1 = f0.then(exec, [&](async_future<int> predecessor)
    {
      result = predecessor.get() + 7;
    });

    f1.wait();

    assert(result == 20);
  }

  {
    // void -> non-void then()

    async_future<void> f0 = async_future<void>::make_ready();
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    auto f1 = f0.then(exec, [](async_future<void> predecessor)
    {
      predecessor.wait();
      return 20;
    });

    int result = f1.get();
    assert(result == 20);
  }

  {
    // void -> void then()

    async_future<void> f0 = async_future<void>::make_ready();
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    int result = 0;
    auto f1 = f0.then(exec, [&](async_future<void> predecessor)
    {
      predecessor.wait();
      result = 20;
    });

    f1.wait();

    assert(result == 20);
  }
  {
    // async_future from promise

    std::experimental::promise<bool> p;
    async_future<bool> f = p.get_async_future();
    bool continuation_has_run = false;

    has_execute_member exec;
    f.then(exec,
        [&continuation_has_run]( async_future<bool> predecessor)
        {

            assert(false == predecessor.get());
            continuation_has_run = true;

        });

    assert(!continuation_has_run);
    p.set_value(false);
    assert(continuation_has_run);
  }
  std::cout << "OK" << std::endl;
}